

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

void class_addmethod(_class *c,t_method fn,t_symbol *sel,t_atomtype arg1,...)

{
  uint uVar1;
  char in_AL;
  t_symbol *ptVar2;
  t_methodentry *ptVar3;
  t_atomtype *ptVar4;
  ulong uVar5;
  t_atomtype *ptVar6;
  _pdinstance *pdinstance;
  char *pcVar7;
  char *pcVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar argvec [6];
  char local_138 [79];
  undefined1 local_e9;
  t_atomtype local_e8 [8];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (c == (_class *)0x0) {
    return;
  }
  ptVar4 = (t_atomtype *)&stack0x00000008;
  ap[0].gp_offset = 0x20;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (sel == &s_signal) {
    if (c->c_floatsignalin != 0) {
      post("warning: signal method overrides class_mainsignalin");
    }
    c->c_floatsignalin = -1;
LAB_00166300:
    for (uVar10 = 0; (arg1 != A_NULL && (uVar10 < 5)); uVar10 = uVar10 + 1) {
      argvec[uVar10] = (uchar)arg1;
      if (ap[0].gp_offset < 0x29) {
        uVar5 = (ulong)ap[0].gp_offset;
        ap[0].gp_offset = ap[0].gp_offset + 8;
        ptVar6 = (t_atomtype *)((long)local_e8 + uVar5);
      }
      else {
        ptVar6 = ptVar4;
        ptVar4 = ptVar4 + 2;
      }
      arg1 = *ptVar6;
    }
    if (arg1 != A_NULL) {
      if (c->c_name == (t_symbol *)0x0) {
        pcVar8 = "<anon>";
      }
      else {
        pcVar8 = c->c_name->s_name;
      }
      if (sel == (t_symbol *)0x0) {
        pcVar7 = "<nomethod>";
      }
      else {
        pcVar7 = sel->s_name;
      }
      pd_error((void *)0x0,"%s_%s: only 5 arguments are typecheckable; use A_GIMME",pcVar8,pcVar7);
    }
    argvec[uVar10] = '\0';
    uVar1 = c->c_nmethod;
    lVar9 = (long)(int)uVar1;
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    for (lVar11 = 0; uVar10 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
      if ((sel != (t_symbol *)0x0) && (*(t_symbol **)(c->c_methods->me_arg + lVar11 + -0x10) == sel)
         ) {
        snprintf(local_138,0x50,"%s_aliased",sel->s_name);
        local_e9 = 0;
        ptVar2 = dogensym(local_138,(t_symbol *)0x0,pdinstance);
        *(t_symbol **)(c->c_methods->me_arg + lVar11 + -0x10) = ptVar2;
        if (pd_objectmaker == c) {
          logpost((void *)0x0,4,"warning: class \'%s\' overwritten; old one renamed \'%s\'",
                  sel->s_name,local_138);
        }
        else {
          logpost((void *)0x0,4,"warning: old method \'%s\' for class \'%s\' renamed \'%s\'",
                  sel->s_name,c->c_name->s_name,local_138);
        }
      }
    }
    ptVar3 = (t_methodentry *)resizebytes(c->c_methods,lVar9 * 0x18,(long)(int)(uVar1 + 1) * 0x18);
    c->c_methods = ptVar3;
    ptVar3[lVar9].me_name = sel;
    ptVar3[lVar9].me_fun = (t_gotfn)fn;
    *(undefined4 *)ptVar3[lVar9].me_arg = argvec._0_4_;
    *(undefined2 *)(ptVar3[lVar9].me_arg + 4) = argvec._4_2_;
    c->c_nmethod = c->c_nmethod + 1;
  }
  else {
    if (sel == &s_bang) {
      if (arg1 == A_NULL) {
        c->c_bangmethod = (t_bangmethod)fn;
        return;
      }
    }
    else if (sel == &s_float) {
      if ((arg1 == A_FLOAT) && ((int)local_c8 == 0)) {
        c->c_floatmethod = (t_floatmethod)fn;
        return;
      }
    }
    else if (sel == &s_symbol) {
      if ((arg1 == A_SYMBOL) && ((int)local_c8 == 0)) {
        c->c_symbolmethod = (t_symbolmethod)fn;
        return;
      }
    }
    else if (sel == &s_list) {
      if (arg1 == A_GIMME) {
        c->c_listmethod = (t_listmethod)fn;
        return;
      }
    }
    else {
      if (sel != &s_anything) goto LAB_00166300;
      if (arg1 == A_GIMME) {
        c->c_anymethod = (t_anymethod)fn;
        return;
      }
    }
    if (c->c_name == (t_symbol *)0x0) {
      pcVar8 = "<anon>";
    }
    else {
      pcVar8 = c->c_name->s_name;
    }
    if (sel == (t_symbol *)0x0) {
      pcVar7 = "<nomethod>";
    }
    else {
      pcVar7 = sel->s_name;
    }
    bug("class_addmethod: %s_%s: bad argument types\n",pcVar8,pcVar7);
  }
  return;
}

Assistant:

void class_addmethod(t_class *c, t_method fn, t_symbol *sel,
    t_atomtype arg1, ...)
{
    va_list ap;
    t_atomtype argtype = arg1;
    int nargs, i;
    if(!c)
        return;
    va_start(ap, arg1);
        /* "signal" method specifies that we take audio signals but
        that we don't want automatic float to signal conversion.  This
        is obsolete; you should now use the CLASS_MAINSIGNALIN macro. */
    if (sel == &s_signal)
    {
        if (c->c_floatsignalin)
            post("warning: signal method overrides class_mainsignalin");
        c->c_floatsignalin = -1;
    }
        /* check for special cases.  "Pointer" is missing here so that
        pd_objectmaker's pointer method can be typechecked differently.  */
    if (sel == &s_bang)
    {
        if (argtype) goto phooey;
        class_addbang(c, fn);
    }
    else if (sel == &s_float)
    {
        if (argtype != A_FLOAT || va_arg(ap, t_atomtype)) goto phooey;
        class_doaddfloat(c, fn);
    }
    else if (sel == &s_symbol)
    {
        if (argtype != A_SYMBOL || va_arg(ap, t_atomtype)) goto phooey;
        class_addsymbol(c, fn);
    }
    else if (sel == &s_list)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addlist(c, fn);
    }
    else if (sel == &s_anything)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addanything(c, fn);
    }
    else
    {
        unsigned char argvec[MAXPDARG+1];
        nargs = 0;
        while (argtype != A_NULL && nargs < MAXPDARG)
        {
            argvec[nargs++] = argtype;
            argtype = va_arg(ap, t_atomtype);
        }
        if (argtype != A_NULL)
            pd_error(0, "%s_%s: only 5 arguments are typecheckable; use A_GIMME",
                (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
        argvec[nargs] = 0;
#ifdef PDINSTANCE
        for (i = 0; i < pd_ninstances; i++)
        {
            class_addmethodtolist(c, &c->c_methods[i], c->c_nmethod,
                (t_gotfn)fn, sel?dogensym(sel->s_name, 0, pd_instances[i]):0,
                    argvec, pd_instances[i]);
        }
#else
        class_addmethodtolist(c, &c->c_methods, c->c_nmethod,
            (t_gotfn)fn, sel, argvec, &pd_maininstance);
#endif
        c->c_nmethod++;
    }
    goto done;
phooey:
    bug("class_addmethod: %s_%s: bad argument types\n",
        (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
done:
    va_end(ap);
    return;
}